

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O2

void finish_example_scores<true>(vw *all,oaa *o,example *ec)

{
  v_array<char> *pvVar1;
  float *pfVar2;
  int iVar3;
  float *pfVar4;
  namedlabels *this;
  int *piVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  double dVar7;
  v_array<char> vVar8;
  ostream *poVar9;
  ulong uVar10;
  uint32_t pred;
  ulong uVar11;
  int *piVar12;
  uint uVar13;
  float fVar14;
  substring sVar15;
  undefined8 in_stack_fffffffffffffde8;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [22];
  char temp_str [10];
  string local_1c8 [32];
  ostringstream outputStringStream;
  
  uVar13 = (ec->l).multi.label;
  dVar7 = 999.0;
  if (((ulong)uVar13 <= o->k) &&
     (fVar14 = (ec->pred).scalars._begin[uVar13 - 1], dVar7 = 999.0, 0.0 < fVar14)) {
    fVar14 = logf(fVar14);
    dVar7 = (double)(-fVar14 * ec->weight);
  }
  (&all->sd->multiclass_log_loss)[ec->test_only] =
       dVar7 + (&all->sd->multiclass_log_loss)[ec->test_only];
  pfVar4 = (ec->pred).scalars._begin;
  uVar11 = 0;
  uVar10 = 1;
  while( true ) {
    if (o->k <= uVar10) break;
    fVar14 = pfVar4[uVar10];
    pfVar2 = pfVar4 + uVar11;
    uVar13 = (uint)uVar10;
    if (fVar14 < *pfVar2 || fVar14 == *pfVar2) {
      uVar13 = (uint)uVar11;
    }
    uVar10 = (ulong)((uint)uVar10 + 1);
    uVar11 = (ulong)uVar13;
  }
  pred = (uint)uVar11 + 1;
  fVar14 = 0.0;
  if ((ec->l).multi.label != pred) {
    fVar14 = ec->weight;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&outputStringStream);
  for (uVar13 = 0; uVar10 = (ulong)uVar13, uVar10 < o->k; uVar13 = uVar13 + 1) {
    if (uVar10 != 0) {
      std::operator<<((ostream *)&outputStringStream,' ');
    }
    this = all->sd->ldict;
    if (this == (namedlabels *)0x0) {
      std::ostream::_M_insert<unsigned_long>((ulong)&outputStringStream);
    }
    else {
      sVar15 = namedlabels::get(this,uVar13 + 1);
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,sVar15.begin,sVar15.end);
      std::operator<<((ostream *)&outputStringStream,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
    }
    sprintf(temp_str,"%f",SUB84((double)(ec->pred).scalars._begin[uVar10],0));
    poVar9 = std::operator<<((ostream *)&outputStringStream,':');
    std::operator<<(poVar9,temp_str);
  }
  piVar5 = (all->final_prediction_sink)._end;
  pvVar1 = &ec->tag;
  for (piVar12 = (all->final_prediction_sink)._begin; piVar12 != piVar5; piVar12 = piVar12 + 1) {
    iVar3 = *piVar12;
    p_Var6 = all->print_text;
    std::__cxx11::stringbuf::str();
    vVar8._end = (char *)all;
    vVar8._begin = (char *)in_stack_fffffffffffffde8;
    vVar8.end_array._0_4_ = fVar14;
    vVar8.end_array._4_4_ = pred;
    vVar8.erase_count = (size_t)ec;
    (*p_Var6)(iVar3,(string)*pvVar1,vVar8);
    std::__cxx11::string::~string(local_1c8);
  }
  shared_data::update(all->sd,ec->test_only,(ec->l).multi.label != 0xffffffff,fVar14,ec->weight,
                      ec->num_features);
  MULTICLASS::print_update_with_probability(all,ec,pred);
  VW::finish_example(all,ec);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outputStringStream);
  return;
}

Assistant:

void finish_example_scores(vw& all, oaa& o, example& ec)
{
  // === Compute multiclass_log_loss
  // TODO:
  // What to do if the correct label is unknown, i.e. (uint32_t)-1?
  //   Suggestion: increase all.sd->weighted_unlabeled_examples???,
  //               but not sd.example_number, so the average loss is not influenced.
  // What to do if the correct_class_prob==0?
  //   Suggestion: have some maximal multiclass_log_loss limit, e.g. 999.
  float multiclass_log_loss = 999;  // -log(0) = plus infinity
  float correct_class_prob = 0;
  if (probabilities)
  {
    if (ec.l.multi.label <= o.k)  // prevent segmentation fault if labeĺ==(uint32_t)-1
      correct_class_prob = ec.pred.scalars[ec.l.multi.label - 1];
    if (correct_class_prob > 0)
      multiclass_log_loss = -log(correct_class_prob) * ec.weight;
    if (ec.test_only)
      all.sd->holdout_multiclass_log_loss += multiclass_log_loss;
    else
      all.sd->multiclass_log_loss += multiclass_log_loss;
  }
  // === Compute `prediction` and zero_one_loss
  // We have already computed `prediction` in predict_or_learn,
  // but we cannot store it in ec.pred union because we store ec.pred.probs there.
  uint32_t prediction = 0;
  for (uint32_t i = 1; i < o.k; i++)
    if (ec.pred.scalars[i] > ec.pred.scalars[prediction])
      prediction = i;
  prediction++;  // prediction is 1-based index (not 0-based)
  float zero_one_loss = 0;
  if (ec.l.multi.label != prediction)
    zero_one_loss = ec.weight;

  // === Print probabilities for all classes
  char temp_str[10];
  ostringstream outputStringStream;
  for (uint32_t i = 0; i < o.k; i++)
  {
    if (i > 0)
      outputStringStream << ' ';
    if (all.sd->ldict)
    {
      substring ss = all.sd->ldict->get(i + 1);
      outputStringStream << string(ss.begin, ss.end - ss.begin);
    }
    else
      outputStringStream << i + 1;
    sprintf(temp_str, "%f", ec.pred.scalars[i]);  // 0.123 -> 0.123000
    outputStringStream << ':' << temp_str;
  }
  for (int sink : all.final_prediction_sink) all.print_text(sink, outputStringStream.str(), ec.tag);

  // === Report updates using zero-one loss
  all.sd->update(ec.test_only, ec.l.multi.label != (uint32_t)-1, zero_one_loss, ec.weight, ec.num_features);
  // Alternatively, we could report multiclass_log_loss.
  // all.sd->update(ec.test_only, multiclass_log_loss, ec.weight, ec.num_features);
  // Even better would be to report both losses, but this would mean to increase
  // the number of columns and this would not fit narrow screens.
  // So let's report (average) multiclass_log_loss only in the final resume.

  // === Print progress report
  if (probabilities)
    MULTICLASS::print_update_with_probability(all, ec, prediction);
  else
    MULTICLASS::print_update_with_score(all, ec, prediction);
  VW::finish_example(all, ec);
}